

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtUtil.c
# Opt level: O3

void Rwt_ListAddToTail(Rwt_Node_t **ppList,Rwt_Node_t *pNode)

{
  long lVar1;
  long *in_RDI;
  long *plVar2;
  
  do {
    plVar2 = in_RDI;
    lVar1 = *plVar2;
    in_RDI = (long *)(lVar1 + 0x20);
  } while (lVar1 != 0);
  *plVar2 = (long)pNode;
  return;
}

Assistant:

void Rwt_ListAddToTail( Rwt_Node_t ** ppList, Rwt_Node_t * pNode )
{
    Rwt_Node_t * pTemp;
    // find the last one
    for ( pTemp = *ppList; pTemp; pTemp = pTemp->pNext )
        ppList = &pTemp->pNext;
    // attach at the end
    *ppList = pNode;
}